

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
slang::ast::WaitOrderStatement::serializeTo(WaitOrderStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *pAVar1;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  Expression *local_48;
  Expression *ev;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *__range2;
  ASTSerializer *local_18;
  ASTSerializer *serializer_local;
  WaitOrderStatement *this_local;
  
  local_18 = serializer;
  serializer_local = (ASTSerializer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"events");
  ASTSerializer::startArray(serializer,___range2);
  __begin2 = (iterator)&this->events;
  __end2 = nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
           begin((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  ev = (Expression *)
       nonstd::span_lite::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::end
                 ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)__begin2);
  for (; (Expression *)__end2 != ev; __end2 = __end2 + 1) {
    local_48 = *__end2;
    ASTSerializer::startObject(local_18);
    pAVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"target");
    ASTSerializer::write(pAVar1,(int)local_58._M_len,local_58._M_str,(size_t)local_48);
    ASTSerializer::endObject(local_18);
  }
  ASTSerializer::endArray(local_18);
  pAVar1 = local_18;
  if (this->ifTrue != (Statement *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"ifTrue");
    ASTSerializer::write(pAVar1,(int)local_68._M_len,local_68._M_str,(size_t)this->ifTrue);
  }
  pAVar1 = local_18;
  if (this->ifFalse != (Statement *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"ifFalse");
    ASTSerializer::write(pAVar1,(int)local_78._M_len,local_78._M_str,(size_t)this->ifFalse);
  }
  return;
}

Assistant:

void WaitOrderStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("events");
    for (auto ev : events) {
        serializer.startObject();
        serializer.write("target", *ev);
        serializer.endObject();
    }
    serializer.endArray();

    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
}